

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.h
# Opt level: O2

void VP8LPutBits(VP8LBitWriter *bw,uint32_t bits,int n_bits)

{
  int iVar1;
  
  if (0 < n_bits) {
    iVar1 = bw->used;
    if (0x1f < iVar1) {
      VP8LPutBitsFlushBits(bw);
      iVar1 = bw->used;
    }
    bw->bits = bw->bits | (ulong)bits << ((byte)iVar1 & 0x3f);
    bw->used = n_bits + iVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void VP8LPutBits(VP8LBitWriter* const bw,
                                    uint32_t bits, int n_bits) {
  if (sizeof(vp8l_wtype_t) == 4) {
    if (n_bits > 0) {
      if (bw->used >= 32) {
        VP8LPutBitsFlushBits(bw);
      }
      bw->bits |= (vp8l_atype_t)bits << bw->used;
      bw->used += n_bits;
    }
  } else {
    VP8LPutBitsInternal(bw, bits, n_bits);
  }
}